

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::AppendPositionIndependentLinkerFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *config,
          string *lang)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  TargetType TVar6;
  char *pcVar7;
  long *plVar8;
  string *psVar9;
  size_type *psVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *flag;
  _Alloc_hider _Var11;
  string pieFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flagsList;
  string name;
  string mode;
  string supported;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  TVar6 = cmGeneratorTarget::GetType(target);
  if (TVar6 == EXECUTABLE) {
    pcVar7 = cmGeneratorTarget::GetLinkPIEProperty(target,config);
    if (pcVar7 != (char *)0x0) {
      bVar5 = cmSystemTools::IsOn(pcVar7);
      pcVar7 = "NO_PIE";
      if (bVar5) {
        pcVar7 = "PIE";
      }
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,pcVar7,pcVar7 + (ulong)!bVar5 * 3 + 3);
      std::operator+(&local_b8,"CMAKE_",lang);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
      paVar1 = &local_d8.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_d8.field_2._M_allocated_capacity = *psVar10;
        local_d8.field_2._8_8_ = plVar8[3];
        local_d8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar10;
        local_d8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_d8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_70[0]);
      paVar2 = &local_90.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_90.field_2._M_allocated_capacity = *psVar10;
        local_90.field_2._8_8_ = plVar8[3];
        local_90._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar10;
        local_90._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_90._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_50.field_2._M_allocated_capacity = *psVar10;
        local_50.field_2._8_8_ = plVar8[3];
      }
      else {
        local_50.field_2._M_allocated_capacity = *psVar10;
        local_50._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_50._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      pcVar7 = cmMakefile::GetDefinition(this->Makefile,&local_50);
      bVar5 = cmSystemTools::IsOff(pcVar7);
      if (!bVar5) {
        std::operator+(&local_b8,"CMAKE_",lang);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
        psVar10 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_d8.field_2._M_allocated_capacity = *psVar10;
          local_d8.field_2._8_8_ = plVar8[3];
          local_d8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar10;
          local_d8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_d8._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_70[0]);
        psVar10 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_90.field_2._M_allocated_capacity = *psVar10;
          local_90.field_2._8_8_ = plVar8[3];
          local_90._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar10;
          local_90._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_90._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        psVar9 = cmMakefile::GetSafeDefinition(this->Makefile,&local_90);
        pcVar3 = (psVar9->_M_dataplus)._M_p;
        local_d8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,pcVar3,pcVar3 + psVar9->_M_string_length);
        if (local_d8._M_string_length != 0) {
          local_b8._M_dataplus._M_p = (pointer)0x0;
          local_b8._M_string_length = 0;
          local_b8.field_2._M_allocated_capacity = 0;
          cmSystemTools::ExpandListArgument
                    (&local_d8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_b8,false);
          sVar4 = local_b8._M_string_length;
          for (_Var11._M_p = local_b8._M_dataplus._M_p; _Var11._M_p != (pointer)sVar4;
              _Var11._M_p = _Var11._M_p + 0x20) {
            (*this->_vptr_cmLocalGenerator[8])(this,flags,_Var11._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_b8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendPositionIndependentLinkerFlags(
  std::string& flags, cmGeneratorTarget* target, const std::string& config,
  const std::string& lang)
{
  // For now, only EXECUTABLE is concerned
  if (target->GetType() != cmStateEnums::EXECUTABLE) {
    return;
  }

  const char* PICValue = target->GetLinkPIEProperty(config);
  if (PICValue == nullptr) {
    // POSITION_INDEPENDENT_CODE is not set
    return;
  }

  const std::string mode = cmSystemTools::IsOn(PICValue) ? "PIE" : "NO_PIE";

  std::string supported = "CMAKE_" + lang + "_LINK_" + mode + "_SUPPORTED";
  if (cmSystemTools::IsOff(this->Makefile->GetDefinition(supported))) {
    return;
  }

  std::string name = "CMAKE_" + lang + "_LINK_OPTIONS_" + mode;

  auto pieFlags = this->Makefile->GetSafeDefinition(name);
  if (pieFlags.empty()) {
    return;
  }

  std::vector<std::string> flagsList;
  cmSystemTools::ExpandListArgument(pieFlags, flagsList);
  for (const auto& flag : flagsList) {
    this->AppendFlagEscape(flags, flag);
  }
}